

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlob.h
# Opt level: O0

void __thiscall Diligent::IDataBlob::IDataBlob(IDataBlob *this)

{
  IDataBlob *this_local;
  
  IObject::IObject(&this->super_IObject);
  (this->super_IObject)._vptr_IObject = (_func_int **)&PTR___cxa_pure_virtual_010d7548;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(IDataBlob, IObject)
{
    /// Sets the size of the internal data buffer
    VIRTUAL void METHOD(Resize)(THIS_
                                size_t NewSize) PURE;

    /// Returns the size of the internal data buffer
    VIRTUAL size_t METHOD(GetSize)(THIS) CONST PURE;

    /// Returns the pointer to the internal data buffer
    VIRTUAL void* METHOD(GetDataPtr)(THIS_
                                     size_t Offset DEFAULT_VALUE(0)) PURE;

    /// Returns const pointer to the internal data buffer
    VIRTUAL const void* METHOD(GetConstDataPtr)(THIS_
                                                size_t Offset DEFAULT_VALUE(0)) CONST PURE;

#if DILIGENT_CPP_INTERFACE
    template <typename T>
    T* GetDataPtr(size_t Offset = 0)
    {
        return static_cast<T*>(GetDataPtr(Offset));
    }

    template <typename T>
    const T* GetConstDataPtr(size_t Offset = 0) const
    {
        return static_cast<const T*>(GetConstDataPtr(Offset));
    }
#endif
}